

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O0

void ly_load_plugins(void)

{
  DIR *pDVar1;
  int *piVar2;
  char *pcVar3;
  char *local_18;
  char *pluginsdir;
  DIR *dir;
  
  pthread_mutex_lock((pthread_mutex_t *)&plugins_lock);
  plugin_refs = plugin_refs + 1;
  local_18 = getenv("LIBYANG_EXTENSIONS_PLUGINS_DIR");
  if (local_18 == (char *)0x0) {
    local_18 = "/usr/local/lib/libyang/extensions";
  }
  pDVar1 = opendir(local_18);
  if (pDVar1 == (DIR *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
           "Failed to open libyang extensions plugins directory \"%s\" (%s).",local_18,pcVar3);
  }
  else {
    ly_load_plugins_dir((DIR *)pDVar1,local_18,1);
    closedir(pDVar1);
  }
  local_18 = getenv("LIBYANG_USER_TYPES_PLUGINS_DIR");
  if (local_18 == (char *)0x0) {
    local_18 = "/usr/local/lib/libyang/user_types";
  }
  pDVar1 = opendir(local_18);
  if (pDVar1 == (DIR *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
           "Failed to open libyang user types plugins directory \"%s\" (%s).",local_18,pcVar3);
  }
  else {
    ly_load_plugins_dir((DIR *)pDVar1,local_18,0);
    closedir(pDVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&plugins_lock);
  return;
}

Assistant:

API void
ly_load_plugins(void)
{
    DIR* dir;
    const char *pluginsdir;

#ifdef STATIC
    /* lock the extension plugins list */
    pthread_mutex_lock(&plugins_lock);

    ext_plugins = static_load_lyext_plugins(&ext_plugins_count);
    type_plugins = static_load_lytype_plugins(&type_plugins_count);

    int u;
    for (u = 0; u < static_loaded_plugins_count; u++) {
        ly_add_loaded_plugin(strdup(static_loaded_plugins[u]));
    }

    /* unlock the global structures */
    pthread_mutex_unlock(&plugins_lock);
    return;
#endif /* STATIC */

    /* lock the extension plugins list */
    pthread_mutex_lock(&plugins_lock);

    /* increase references */
    ++plugin_refs;

    /* try to get the plugins directory from environment variable */
    pluginsdir = getenv("LIBYANG_EXTENSIONS_PLUGINS_DIR");
    if (!pluginsdir) {
        pluginsdir = LYEXT_PLUGINS_DIR;
    }

    dir = opendir(pluginsdir);
    if (!dir) {
        /* no directory (or no access to it), no extension plugins */
        LOGWRN(NULL, "Failed to open libyang extensions plugins directory \"%s\" (%s).", pluginsdir, strerror(errno));
    } else {
        ly_load_plugins_dir(dir, pluginsdir, 1);
        closedir(dir);
    }

    /* try to get the plugins directory from environment variable */
    pluginsdir = getenv("LIBYANG_USER_TYPES_PLUGINS_DIR");
    if (!pluginsdir) {
        pluginsdir = LY_USER_TYPES_PLUGINS_DIR;
    }

    dir = opendir(pluginsdir);
    if (!dir) {
        /* no directory (or no access to it), no extension plugins */
        LOGWRN(NULL, "Failed to open libyang user types plugins directory \"%s\" (%s).", pluginsdir, strerror(errno));
    } else {
        ly_load_plugins_dir(dir, pluginsdir, 0);
        closedir(dir);
    }

    /* unlock the global structures */
    pthread_mutex_unlock(&plugins_lock);
}